

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImDrawCmd>::push_back(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  uint *puVar1;
  ImDrawCmd *pIVar2;
  ImTextureID pvVar3;
  undefined8 uVar4;
  ImDrawCallback p_Var5;
  void *pvVar6;
  ImDrawCmd *pIVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int new_capacity;
  
  iVar16 = this->Size;
  if (iVar16 == this->Capacity) {
    if (iVar16 == 0) {
      iVar15 = 8;
    }
    else {
      iVar15 = iVar16 / 2 + iVar16;
    }
    new_capacity = iVar16 + 1;
    if (iVar16 + 1 < iVar15) {
      new_capacity = iVar15;
    }
    reserve(this,new_capacity);
    iVar16 = this->Size;
  }
  fVar9 = (v->ClipRect).x;
  fVar10 = (v->ClipRect).y;
  fVar11 = (v->ClipRect).z;
  fVar12 = (v->ClipRect).w;
  pvVar3 = v->TextureId;
  uVar13 = v->VtxOffset;
  uVar14 = v->IdxOffset;
  uVar8 = v->IdxOffset;
  uVar4 = *(undefined8 *)&v->ElemCount;
  p_Var5 = v->UserCallback;
  pvVar6 = v->UserCallbackData;
  pIVar2 = this->Data;
  pIVar7 = pIVar2 + iVar16;
  puVar1 = &pIVar7->VtxOffset;
  pIVar7->VtxOffset = v->VtxOffset;
  pIVar7->IdxOffset = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar4;
  *(ImDrawCallback *)(puVar1 + 4) = p_Var5;
  *(void **)(puVar1 + 6) = pvVar6;
  pIVar2 = pIVar2 + iVar16;
  (pIVar2->ClipRect).x = fVar9;
  (pIVar2->ClipRect).y = fVar10;
  (pIVar2->ClipRect).z = fVar11;
  (pIVar2->ClipRect).w = fVar12;
  pIVar2->TextureId = pvVar3;
  pIVar2->VtxOffset = uVar13;
  pIVar2->IdxOffset = uVar14;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }